

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TweakableParser.cpp
# Opt level: O2

Pair<Corrade::Utility::TweakableState,_long>
Corrade::Utility::TweakableParser<long>::parse(StringView value)

{
  StringView value_00;
  long lVar1;
  char *pcVar2;
  Debug *pDVar3;
  undefined8 uVar4;
  undefined8 extraout_RAX;
  size_t in_RDX;
  char *in_RSI;
  anon_unknown_14 *in_RDI;
  StringView value_01;
  StringView value_02;
  Pair<const_char_*,_int> PVar5;
  BasicStringView<const_char> value_03;
  Pair<Corrade::Utility::TweakableState,_long> PVar6;
  char *end;
  BasicStringView<const_char> local_60;
  Warning local_50;
  anon_unknown_14 *local_28;
  
  value_01._sizePlusFlags = in_RDX;
  value_01._data = in_RSI;
  local_60._data = (char *)in_RDI;
  local_60._sizePlusFlags = (size_t)in_RSI;
  PVar5 = anon_unknown_14::integerBase(in_RDI,value_01);
  lVar1 = strtol(PVar5._first,(char **)&local_28,PVar5._second);
  if (local_28 == in_RDI) {
    Warning::Warning(&local_50,(Flags)0x0);
    pDVar3 = Debug::operator<<(&local_50.super_Debug,"Utility::TweakableParser:");
    value_02._sizePlusFlags = (size_t)in_RSI;
    value_02._data = (char *)in_RDI;
    pDVar3 = Debug::operator<<(pDVar3,value_02);
    Debug::operator<<(pDVar3,"is not an integer literal");
  }
  else {
    pcVar2 = Containers::BasicStringView<const_char>::back(&local_60);
    if (*pcVar2 != 'l') {
      pcVar2 = Containers::BasicStringView<const_char>::back(&local_60);
      if (*pcVar2 != 'L') {
        Warning::Warning(&local_50,(Flags)0x0);
        pDVar3 = Debug::operator<<(&local_50.super_Debug,"Utility::TweakableParser:");
        value_00._sizePlusFlags = local_60._sizePlusFlags;
        value_00._data = local_60._data;
        pDVar3 = Debug::operator<<(pDVar3,value_00);
        Debug::operator<<(pDVar3,"has an unexpected suffix, expected l");
        goto LAB_00154143;
      }
    }
    if (local_28 ==
        (anon_unknown_14 *)(local_60._data + ((local_60._sizePlusFlags & 0x3fffffffffffffff) - 1)))
    {
      uVar4 = CONCAT71((int7)((ulong)(local_60._data +
                                     ((local_60._sizePlusFlags & 0x3fffffffffffffff) - 1)) >> 8),1);
      goto LAB_00154151;
    }
    Warning::Warning(&local_50,(Flags)0x0);
    pDVar3 = Debug::operator<<(&local_50.super_Debug,
                               "Utility::TweakableParser: unexpected characters");
    value_03 = Containers::BasicStringView<const_char>::suffix(&local_60,(char *)local_28);
    pDVar3 = Debug::operator<<(pDVar3,value_03);
    Debug::operator<<(pDVar3,"after an integer literal");
  }
LAB_00154143:
  Warning::~Warning(&local_50);
  uVar4 = CONCAT71((int7)((ulong)extraout_RAX >> 8),2);
  lVar1 = 0;
LAB_00154151:
  PVar6._second = lVar1;
  PVar6._0_8_ = uVar4;
  return PVar6;
}

Assistant:

Containers::Pair<TweakableState, long> TweakableParser<long>::parse(Containers::StringView value) {
    const Containers::Pair<const char*, int> valueBase = integerBase(value);
    char* end;
    const long result = std::strtol(valueBase.first(), &end, valueBase.second());

    if(end == value.begin()) {
        Warning{} << "Utility::TweakableParser:" << value << "is not an integer literal";
        return {TweakableState::Recompile, {}};
    }

    /* If value would be empty, the above catches that */
    if(value.back() != 'l' && value.back() != 'L') {
        Warning{} << "Utility::TweakableParser:" << value << "has an unexpected suffix, expected l";
        return {TweakableState::Recompile, {}};
    }

    if(end != value.end() - 1) {
        Warning{} << "Utility::TweakableParser: unexpected characters" << value.suffix(end) << "after an integer literal";
        return {TweakableState::Recompile, {}};
    }

    return {TweakableState::Success, result};
}